

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallGenerator::CreateComponentTest_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallGenerator *this,char *component)

{
  allocator local_22;
  undefined1 local_21;
  char *local_20;
  char *component_local;
  cmInstallGenerator *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = component;
  component_local = (char *)this;
  this_local = (cmInstallGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             "NOT CMAKE_INSTALL_COMPONENT OR \"${CMAKE_INSTALL_COMPONENT}\" STREQUAL \"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_20);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
  return __return_storage_ptr__;
}

Assistant:

std::string
cmInstallGenerator::CreateComponentTest(const char* component)
{
  std::string result = "NOT CMAKE_INSTALL_COMPONENT OR "
    "\"${CMAKE_INSTALL_COMPONENT}\" STREQUAL \"";
  result += component;
  result += "\"";
  return result;
}